

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

int compute_action(lemon *lemp,action *ap)

{
  int local_1c;
  int act;
  action *ap_local;
  lemon *lemp_local;
  
  switch(ap->type) {
  case SHIFT:
    local_1c = ((ap->x).stp)->statenum;
    break;
  case ACCEPT:
    local_1c = lemp->nstate + lemp->nrule * 2 + 1;
    break;
  case REDUCE:
    local_1c = ((ap->x).rp)->iRule + lemp->nstate + lemp->nrule;
    break;
  case ERROR:
    local_1c = lemp->nstate + lemp->nrule * 2;
    break;
  default:
    local_1c = -1;
    break;
  case SHIFTREDUCE:
    local_1c = ((ap->x).rp)->iRule + lemp->nstate;
  }
  return local_1c;
}

Assistant:

PRIVATE int compute_action(struct lemon *lemp, struct action *ap)
{
  int act;
  switch( ap->type ){
    case SHIFT:  act = ap->x.stp->statenum;                        break;
    case SHIFTREDUCE: act = ap->x.rp->iRule + lemp->nstate;        break;
    case REDUCE: act = ap->x.rp->iRule + lemp->nstate+lemp->nrule; break;
    case ERROR:  act = lemp->nstate + lemp->nrule*2;               break;
    case ACCEPT: act = lemp->nstate + lemp->nrule*2 + 1;           break;
    default:     act = -1; break;
  }
  return act;
}